

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KirkwoodBuff.cpp
# Opt level: O3

void __thiscall
OpenMD::KirkwoodBuff::collectHistograms
          (KirkwoodBuff *this,StuntDouble *sd1,StuntDouble *sd2,int pairIndex)

{
  double *pdVar1;
  int *piVar2;
  double dVar3;
  char cVar4;
  double dVar5;
  uint i_1;
  long lVar6;
  double tmp;
  Vector<double,_3U> result;
  Vector3d r12;
  Vector3d pos2;
  Vector3d pos1;
  double local_88 [4];
  Vector3d local_68;
  double local_48 [4];
  double local_28 [3];
  
  if (sd1 != sd2) {
    cVar4 = (((this->super_MultiComponentRDF).super_StaticAnalyser.info_)->simParams_->
            UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
    lVar6 = *(long *)((long)&(sd1->snapshotMan_->currentSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + sd1->storage_);
    local_28[2] = (double)*(undefined8 *)(lVar6 + 0x10 + (long)sd1->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar6 + (long)sd1->localIndex_ * 0x18);
    local_28[0] = *pdVar1;
    local_28[1] = pdVar1[1];
    lVar6 = *(long *)((long)&(sd2->snapshotMan_->currentSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + sd2->storage_);
    local_48[2] = (double)*(undefined8 *)(lVar6 + 0x10 + (long)sd2->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar6 + (long)sd2->localIndex_ * 0x18);
    local_48[0] = *pdVar1;
    local_48[1] = pdVar1[1];
    local_88[0] = 0.0;
    local_88[1] = 0.0;
    local_88[2] = 0.0;
    lVar6 = 0;
    do {
      local_88[lVar6] = local_48[lVar6] - local_28[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    local_68.super_Vector<double,_3U>.data_[2] = local_88[2];
    local_68.super_Vector<double,_3U>.data_[0] = local_88[0];
    local_68.super_Vector<double,_3U>.data_[1] = local_88[1];
    if (cVar4 != '\0') {
      Snapshot::wrapVector((this->super_MultiComponentRDF).currentSnapshot_,&local_68);
    }
    dVar5 = 0.0;
    lVar6 = 0;
    do {
      dVar3 = local_68.super_Vector<double,_3U>.data_[lVar6];
      dVar5 = dVar5 + dVar3 * dVar3;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    if (dVar5 < this->len_ + this->deltaR_) {
      piVar2 = (int *)(*(long *)&(this->histograms_).
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[pairIndex].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + (long)(int)(dVar5 / this->deltaR_) * 4);
      *piVar2 = *piVar2 + 1;
    }
  }
  return;
}

Assistant:

void KirkwoodBuff::collectHistograms(StuntDouble* sd1, StuntDouble* sd2,
                                       int pairIndex) {
    if (sd1 == sd2) { return; }

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    Vector3d pos1 = sd1->getPos();
    Vector3d pos2 = sd2->getPos();
    Vector3d r12  = pos2 - pos1;
    if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(r12);

    RealType distance = r12.length();

    // Bins are set to the inner radius of a spherical shell.
    if (distance < (len_ + deltaR_)) {
      int whichBin = static_cast<int>(distance / deltaR_);
      histograms_[pairIndex][whichBin] += 1;
    }
  }